

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench.cc
# Opt level: O0

void __thiscall leveldb::Benchmark::PrintEnvironment(Benchmark *this)

{
  FILE *pFVar1;
  bool bVar2;
  char *pcVar3;
  undefined8 uVar4;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  Slice s;
  Slice s_00;
  Slice local_4f8 [2];
  Slice local_4d8;
  Slice local_4c8 [2];
  Slice local_4a8;
  Slice local_498;
  undefined1 local_488 [8];
  Slice val;
  char *local_470;
  undefined1 local_468 [8];
  Slice key;
  char *sep;
  string cache_size;
  string local_430 [8];
  string cpu_type;
  uint local_40c;
  char local_408 [4];
  int num_cpus;
  char line [1000];
  FILE *cpuinfo;
  time_t now;
  Benchmark *this_local;
  
  now = (time_t)this;
  fprintf(_stderr,"LevelDB:    version %d.%d\n",1,0x16);
  cpuinfo = (FILE *)time((time_t *)0x0);
  pFVar1 = _stderr;
  pcVar3 = ctime((time_t *)&cpuinfo);
  fprintf(pFVar1,"Date:       %s",pcVar3);
  line._992_8_ = fopen("/proc/cpuinfo","r");
  if ((FILE *)line._992_8_ != (FILE *)0x0) {
    local_40c = 0;
    std::__cxx11::string::string(local_430);
    std::__cxx11::string::string((string *)&sep);
    while (pcVar3 = fgets(local_408,1000,(FILE *)line._992_8_), pcVar3 != (char *)0x0) {
      key.size_ = (size_t)strchr(local_408,0x3a);
      if ((char *)key.size_ != (char *)0x0) {
        Slice::Slice((Slice *)&val.size_,local_408,(size_t)(key.size_ + (-1 - (long)local_408)));
        s.size_ = extraout_RDX;
        s.data_ = local_470;
        _local_468 = anon_unknown_0::TrimSpace((anon_unknown_0 *)val.size_,s);
        Slice::Slice(&local_498,(char *)(key.size_ + 1));
        s_00.size_ = extraout_RDX_00;
        s_00.data_ = (char *)local_498.size_;
        _local_488 = anon_unknown_0::TrimSpace((anon_unknown_0 *)local_498.data_,s_00);
        Slice::Slice(&local_4a8,"model name");
        bVar2 = operator==((Slice *)local_468,&local_4a8);
        if (bVar2) {
          local_40c = local_40c + 1;
          Slice::ToString_abi_cxx11_(local_4c8);
          std::__cxx11::string::operator=(local_430,(string *)local_4c8);
          std::__cxx11::string::~string((string *)local_4c8);
        }
        else {
          Slice::Slice(&local_4d8,"cache size");
          bVar2 = operator==((Slice *)local_468,&local_4d8);
          if (bVar2) {
            Slice::ToString_abi_cxx11_(local_4f8);
            std::__cxx11::string::operator=((string *)&sep,(string *)local_4f8);
            std::__cxx11::string::~string((string *)local_4f8);
          }
        }
      }
    }
    fclose((FILE *)line._992_8_);
    pFVar1 = _stderr;
    uVar4 = std::__cxx11::string::c_str();
    fprintf(pFVar1,"CPU:        %d * %s\n",(ulong)local_40c,uVar4);
    pFVar1 = _stderr;
    uVar4 = std::__cxx11::string::c_str();
    fprintf(pFVar1,"CPUCache:   %s\n",uVar4);
    std::__cxx11::string::~string((string *)&sep);
    std::__cxx11::string::~string(local_430);
  }
  return;
}

Assistant:

void PrintEnvironment() {
    std::fprintf(stderr, "LevelDB:    version %d.%d\n", kMajorVersion,
                 kMinorVersion);

#if defined(__linux)
    time_t now = time(nullptr);
    std::fprintf(stderr, "Date:       %s",
                 ctime(&now));  // ctime() adds newline

    FILE* cpuinfo = std::fopen("/proc/cpuinfo", "r");
    if (cpuinfo != nullptr) {
      char line[1000];
      int num_cpus = 0;
      std::string cpu_type;
      std::string cache_size;
      while (fgets(line, sizeof(line), cpuinfo) != nullptr) {
        const char* sep = strchr(line, ':');
        if (sep == nullptr) {
          continue;
        }
        Slice key = TrimSpace(Slice(line, sep - 1 - line));
        Slice val = TrimSpace(Slice(sep + 1));
        if (key == "model name") {
          ++num_cpus;
          cpu_type = val.ToString();
        } else if (key == "cache size") {
          cache_size = val.ToString();
        }
      }
      std::fclose(cpuinfo);
      std::fprintf(stderr, "CPU:        %d * %s\n", num_cpus, cpu_type.c_str());
      std::fprintf(stderr, "CPUCache:   %s\n", cache_size.c_str());
    }
#endif
  }